

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMathCommand.cxx
# Opt level: O3

bool __thiscall
cmMathCommand::InitialPass
          (cmMathCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  bool bVar1;
  int iVar2;
  string e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __rhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == __rhs) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"must be called with at least one argument.","");
    cmCommand::SetError(&this->super_cmCommand,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == &local_38.field_2) {
      return false;
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)__rhs);
    if (iVar2 == 0) {
      bVar1 = HandleExprCommand(this,args);
      return bVar1;
    }
    std::operator+(&local_38,"does not recognize sub-command ",__rhs);
    cmCommand::SetError(&this->super_cmCommand,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == &local_38.field_2) {
      return false;
    }
  }
  operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  return false;
}

Assistant:

bool cmMathCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if ( args.size() < 1 )
    {
    this->SetError("must be called with at least one argument.");
    return false;
    }
  const std::string &subCommand = args[0];
  if(subCommand == "EXPR")
    {
    return this->HandleExprCommand(args);
    }
  std::string e = "does not recognize sub-command "+subCommand;
  this->SetError(e);
  return false;
}